

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int nodeRowidIndex(Rtree *pRtree,RtreeNode *pNode,i64 iRowid,int *piIndex)

{
  int iVar1;
  i64 iVar2;
  int local_34;
  int nCell;
  int ii;
  int *piIndex_local;
  i64 iRowid_local;
  RtreeNode *pNode_local;
  Rtree *pRtree_local;
  
  iVar1 = readInt16(pNode->zData + 2);
  local_34 = 0;
  while( true ) {
    if (iVar1 <= local_34) {
      return 0x10b;
    }
    iVar2 = nodeGetRowid(pRtree,pNode,local_34);
    if (iVar2 == iRowid) break;
    local_34 = local_34 + 1;
  }
  *piIndex = local_34;
  return 0;
}

Assistant:

static int nodeRowidIndex(
  Rtree *pRtree, 
  RtreeNode *pNode, 
  i64 iRowid,
  int *piIndex
){
  int ii;
  int nCell = NCELL(pNode);
  assert( nCell<200 );
  for(ii=0; ii<nCell; ii++){
    if( nodeGetRowid(pRtree, pNode, ii)==iRowid ){
      *piIndex = ii;
      return SQLITE_OK;
    }
  }
  RTREE_IS_CORRUPT(pRtree);
  return SQLITE_CORRUPT_VTAB;
}